

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFARecurseDeterminism
              (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,int fromnr,int tonr,xmlRegAtomPtr atom)

{
  int iVar1;
  uint uVar2;
  xmlRegTrans *pxVar3;
  xmlRegAtomPtr atom1;
  int iVar4;
  uint deep;
  long lVar5;
  int iVar6;
  
  iVar6 = 1;
  if (((state != (xmlRegStatePtr)0x0) && (state->markd != XML_REGEXP_MARK_VISITED)) &&
     (iVar1 = state->nbTrans, 0 < (long)iVar1)) {
    deep = ~ctxt->flags & 1;
    lVar5 = 0;
    do {
      pxVar3 = state->trans;
      uVar2 = *(uint *)((long)&pxVar3->to + lVar5);
      if (uVar2 != fromnr && -1 < (int)uVar2) {
        atom1 = *(xmlRegAtomPtr *)((long)&pxVar3->atom + lVar5);
        if (atom1 == (xmlRegAtomPtr)0x0) {
          state->markd = XML_REGEXP_MARK_VISITED;
          iVar4 = xmlFARecurseDeterminism(ctxt,ctxt->states[uVar2],fromnr,tonr,atom);
          if (iVar4 == 0) {
            iVar6 = 0;
          }
        }
        else {
          iVar4 = xmlFACompareAtoms(atom1,atom,deep);
          if (iVar4 != 0) {
            if (*(int *)((long)&pxVar3->to + lVar5) == tonr) {
              iVar4 = xmlFAEqualAtoms(*(xmlRegAtomPtr *)((long)&pxVar3->atom + lVar5),atom,deep);
              if (iVar4 == 0) goto LAB_0017f192;
            }
            else {
LAB_0017f192:
              iVar6 = 0;
            }
            *(undefined4 *)((long)&pxVar3->nd + lVar5) = 1;
          }
        }
      }
      lVar5 = lVar5 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar5);
  }
  return iVar6;
}

Assistant:

static int
xmlFARecurseDeterminism(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	                int fromnr, int tonr, xmlRegAtomPtr atom) {
    int ret = 1;
    int res;
    int transnr, nbTrans;
    xmlRegTransPtr t1;
    int deep = 1;

    if (state == NULL)
	return(ret);
    if (state->markd == XML_REGEXP_MARK_VISITED)
	return(ret);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * don't recurse on transitions potentially added in the course of
     * the elimination.
     */
    nbTrans = state->nbTrans;
    for (transnr = 0;transnr < nbTrans;transnr++) {
	t1 = &(state->trans[transnr]);
	/*
	 * check transitions conflicting with the one looked at
	 */
        if ((t1->to < 0) || (t1->to == fromnr))
            continue;
	if (t1->atom == NULL) {
	    state->markd = XML_REGEXP_MARK_VISITED;
	    res = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
		                          fromnr, tonr, atom);
	    if (res == 0) {
	        ret = 0;
		/* t1->nd = 1; */
	    }
	    continue;
	}
	if (xmlFACompareAtoms(t1->atom, atom, deep)) {
            /* Treat equal transitions as deterministic. */
            if ((t1->to != tonr) ||
                (!xmlFAEqualAtoms(t1->atom, atom, deep)))
                ret = 0;
	    /* mark the transition as non-deterministic */
	    t1->nd = 1;
	}
    }
    return(ret);
}